

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

ULONG __thiscall
Js::ScriptContext::GetParseFlags
          (ScriptContext *this,LoadScriptFlag loadScriptFlag,Utf8SourceInfo *pSourceInfo,
          SourceContextInfo *sourceContextInfo)

{
  bool bVar1;
  ULONG UVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = ((loadScriptFlag & LoadScriptFlag_CreateParserState) >> 1) +
          (loadScriptFlag & LoadScriptFlag_Expression) * 2 + 0x1000;
  if ((loadScriptFlag & LoadScriptFlag_disableDeferredParse) == LoadScriptFlag_None) {
    uVar3 = pSourceInfo->m_cchLength;
    bVar1 = SourceContextInfo::IsSourceProfileLoaded(sourceContextInfo);
    UVar2 = Parser::GetDeferralThreshold(bVar1);
    uVar4 = (uint)(UVar2 < uVar3) << 3 | uVar4 | 0x10;
  }
  uVar4 = (loadScriptFlag & LoadScriptFlag_disableAsmJs) << 0xb | loadScriptFlag >> 4 & 0x40 | uVar4
  ;
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01436260,EvalCompilePhase);
  uVar3 = uVar4 | 0xc00;
  if (!bVar1) {
    uVar3 = uVar4;
  }
  uVar3 = (loadScriptFlag & LoadScriptFlag_isByteCodeBufferForLibrary) << 0xd | uVar3;
  if (((loadScriptFlag & LoadScriptFlag_Module) != LoadScriptFlag_None) &&
     (((this->config).threadConfig)->m_ES6Module != false)) {
    uVar3 = uVar3 | 0x2000;
  }
  return (loadScriptFlag & LoadScriptFlag_LibraryCode) << 10 | uVar3;
}

Assistant:

ULONG ScriptContext::GetParseFlags(LoadScriptFlag loadScriptFlag, Utf8SourceInfo* pSourceInfo, SourceContextInfo* sourceContextInfo)
    {
        // TODO: yongqu handle non-global code.
        ULONG grfscr = fscrGlobalCode | ((loadScriptFlag & LoadScriptFlag_Expression) == LoadScriptFlag_Expression ? fscrReturnExpression : 0);

        if ((loadScriptFlag & LoadScriptFlag_CreateParserState) == LoadScriptFlag_CreateParserState)
        {
            grfscr |= fscrCreateParserState;
        }

        if((loadScriptFlag & LoadScriptFlag_disableDeferredParse) != LoadScriptFlag_disableDeferredParse)
        {
            grfscr |= fscrCanDeferFncParse;
            if(pSourceInfo->GetCchLength() > Parser::GetDeferralThreshold(sourceContextInfo->IsSourceProfileLoaded()))
            {
                grfscr |= fscrWillDeferFncParse;
            }
        }

        if ((loadScriptFlag & LoadScriptFlag_StrictMode) == LoadScriptFlag_StrictMode)
        {
            grfscr |= fscrUseStrictMode;
        }

        if ((loadScriptFlag & LoadScriptFlag_disableAsmJs) == LoadScriptFlag_disableAsmJs)
        {
            grfscr |= fscrNoAsmJs;
        }

        if (PHASE_FORCE1(Js::EvalCompilePhase))
        {
            // pretend it is eval
            grfscr |= (fscrEval | fscrEvalCode);
        }

        if ((loadScriptFlag & LoadScriptFlag_isByteCodeBufferForLibrary) == LoadScriptFlag_isByteCodeBufferForLibrary)
        {
            grfscr |= fscrNoPreJit;
        }

        if (((loadScriptFlag & LoadScriptFlag_Module) == LoadScriptFlag_Module) &&
            GetConfig()->IsES6ModuleEnabled())
        {
            grfscr |= fscrIsModuleCode;
        }

        if ((loadScriptFlag & LoadScriptFlag_LibraryCode) == LoadScriptFlag_LibraryCode)
        {
            grfscr |= fscrIsLibraryCode;
        }

        return grfscr;
    }